

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

void rcg::checkFeature(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                      bool igncache)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *this;
  bool in_R9B;
  string cvalue;
  ostringstream out;
  string local_1d8;
  string local_1b8 [32];
  ostringstream local_198 [376];
  
  getString_abi_cxx11_
            (&local_1d8,(rcg *)nodemap,(shared_ptr<GenApi_3_4::CNodeMapRef> *)name,(char *)0x1,
             igncache,in_R9B);
  iVar1 = std::__cxx11::string::compare((char *)&local_1d8);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_1d8);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar2 = std::operator<<((ostream *)local_198,name);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," == ",4);
      poVar2 = std::operator<<(poVar2,value);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," expected: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(this,local_1b8);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void checkFeature(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                  const char *value, bool igncache)
{
  std::string cvalue=getString(nodemap, name, true, igncache);

  if (cvalue != "" && cvalue != value)
  {
    std::ostringstream out;
    out << name << " == " << value << " expected: " << cvalue;
    throw std::invalid_argument(out.str());
  }
}